

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
               uv_udp_send_cb send_cb)

{
  undefined4 in_ECX;
  long in_RSI;
  uv_udp_send_cb in_RDI;
  uv_udp_t *in_R8;
  uv_buf_t *in_R9;
  uint addrlen;
  uint nbufs_00;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(int *)(in_RSI + 0x18) == 0xf) {
    if (*(short *)&in_R8->close_cb == 2) {
      nbufs_00 = 0x10;
    }
    else {
      if (*(short *)&in_R8->close_cb != 10) {
        return -0x16;
      }
      nbufs_00 = 0x1c;
    }
    local_4 = uv__udp_send((uv_udp_send_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,in_R9,
                           nbufs_00,(sockaddr *)in_R9,0,in_RDI);
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int uv_udp_send(uv_udp_send_t* req,
                uv_udp_t* handle,
                const uv_buf_t bufs[],
                unsigned int nbufs,
                const struct sockaddr* addr,
                uv_udp_send_cb send_cb) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__udp_send(req, handle, bufs, nbufs, addr, addrlen, send_cb);
}